

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O0

bool __thiscall draco::OctahedronToolBox::IsInDiamond(OctahedronToolBox *this,int32_t *s,int32_t *t)

{
  int iVar1;
  int iVar2;
  uint32_t st;
  int32_t *t_local;
  int32_t *s_local;
  OctahedronToolBox *this_local;
  
  iVar1 = *s;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  iVar2 = *t;
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  return (uint)(iVar1 + iVar2) <= (uint)this->center_value_;
}

Assistant:

inline bool IsInDiamond(const int32_t &s, const int32_t &t) const {
    // Expect center already at origin.
    DRACO_DCHECK_LE(s, center_value_);
    DRACO_DCHECK_LE(t, center_value_);
    DRACO_DCHECK_GE(s, -center_value_);
    DRACO_DCHECK_GE(t, -center_value_);
    const uint32_t st =
        static_cast<uint32_t>(std::abs(s)) + static_cast<uint32_t>(std::abs(t));
    return st <= center_value_;
  }